

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O2

void jp2_cdef_dumpdata(jp2_box_t *box,FILE *out)

{
  jp2_cdefchan_t *pjVar1;
  uint uVar2;
  ulong uVar3;
  
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < (box->data).ftyp.majver; uVar2 = uVar2 + 1) {
    pjVar1 = (box->data).cdef.ents;
    fprintf((FILE *)out,"channo=%lu; type=%lu; assoc=%lu\n",pjVar1[uVar3].channo,pjVar1[uVar3].type,
            pjVar1[uVar3].assoc);
  }
  return;
}

Assistant:

static void jp2_cdef_dumpdata(jp2_box_t *box, FILE *out)
{
	jp2_cdef_t *cdef = &box->data.cdef;
	unsigned int i;
	for (i = 0; i < cdef->numchans; ++i) {
		fprintf(out,
		  "channo=%"PRIuFAST16"; type=%"PRIuFAST16"; assoc=%"PRIuFAST16"\n",
		  cdef->ents[i].channo, cdef->ents[i].type, cdef->ents[i].assoc);
	}
}